

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

void __thiscall
icu_63::GregorianCalendar::roll
          (GregorianCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  EDaysOfWeek EVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  UCalendarDateFields UStack_60;
  
  if ((amount == 0) || (U_ZERO_ERROR < *status)) {
    return;
  }
  iVar3 = Calendar::get(&this->super_Calendar,UCAL_EXTENDED_YEAR,status);
  iVar9 = 0;
  bVar1 = true;
  dVar12 = 0.0;
  if (((field & ~UCAL_YEAR) == UCAL_WEEK_OF_MONTH) && (iVar3 == this->fGregorianCutoverYear)) {
    iVar4 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                      (this,(ulong)(uint)(this->super_Calendar).fFields[2]);
    dVar12 = (this->super_Calendar).fTime;
    iVar6 = (this->super_Calendar).fFields[5];
    dVar11 = this->fGregorianCutover;
    iVar7 = -10;
    if (dVar12 < dVar11) {
      iVar7 = 0;
    }
    iVar9 = iVar7 + iVar6;
    dVar12 = (double)(iVar7 + -1 + iVar6) * -86400000.0 + dVar12;
    if (dVar11 <= dVar12) goto LAB_001ef05a;
    iVar4 = iVar4 + -10;
    if (dVar11 <= (double)iVar4 * 86400000.0 + dVar12) {
      bVar1 = false;
    }
  }
  else {
LAB_001ef05a:
    iVar4 = 0;
  }
  if (field == UCAL_DATE) {
    if (!bVar1) {
      dVar11 = uprv_fmod_63((double)amount * 86400000.0 + ((this->super_Calendar).fTime - dVar12),
                            (double)iVar4 * 86400000.0);
      dVar11 = (double)(~-(ulong)(dVar11 < 0.0) & (ulong)dVar11 |
                       (ulong)((double)iVar4 * 86400000.0 + dVar11) & -(ulong)(dVar11 < 0.0));
LAB_001ef217:
      Calendar::setTimeInMillis(&this->super_Calendar,dVar11 + dVar12,status);
      return;
    }
    UStack_60 = UCAL_DATE;
  }
  else if (field == UCAL_WEEK_OF_MONTH) {
    if (!bVar1) {
      iVar6 = (this->super_Calendar).fFields[7];
      EVar8 = Calendar::getFirstDayOfWeek(&this->super_Calendar);
      iVar6 = iVar6 - EVar8;
      iVar7 = iVar6 + 7;
      if (-1 < iVar6) {
        iVar7 = iVar6;
      }
      iVar6 = ((iVar7 - iVar9) + 1) % 7;
      iVar10 = iVar6 + 7;
      if (-1 < iVar6) {
        iVar10 = iVar6;
      }
      bVar2 = Calendar::getMinimalDaysInFirstWeek(&this->super_Calendar);
      iVar6 = 8;
      if ((uint)bVar2 <= 7U - iVar10) {
        iVar6 = 1;
      }
      iVar6 = iVar6 - iVar10;
      uVar5 = (iVar4 - (((iVar4 - iVar9) + iVar7) % 7 + iVar6)) + 7;
      iVar9 = ((amount * 7 + iVar9) - iVar6) % (int)uVar5;
      iVar9 = (iVar9 >> 0x1f & uVar5) + iVar6 + iVar9;
      if (iVar9 < 2) {
        iVar9 = 1;
      }
      if (iVar4 <= iVar9) {
        iVar9 = iVar4;
      }
      dVar11 = (double)(iVar9 + -1) * 86400000.0;
      goto LAB_001ef217;
    }
    UStack_60 = UCAL_WEEK_OF_MONTH;
  }
  else {
    UStack_60 = field;
    if (field == UCAL_WEEK_OF_YEAR) {
      iVar3 = Calendar::get(&this->super_Calendar,UCAL_WEEK_OF_YEAR,status);
      uVar5 = Calendar::get(&this->super_Calendar,UCAL_YEAR_WOY,status);
      iVar9 = (this->super_Calendar).fFields[6];
      if ((this->super_Calendar).fFields[2] == 0) {
        if (0x33 < iVar3) {
          iVar6 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)uVar5);
          iVar9 = iVar9 + iVar6;
        }
      }
      else if (iVar3 == 1) {
        iVar6 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)(uVar5 - 1))
        ;
        iVar9 = iVar9 - iVar6;
      }
      iVar6 = iVar3 + amount;
      if ((iVar3 + amount) - 0x35U < 0xffffffcc) {
        iVar7 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)uVar5);
        iVar4 = (this->super_Calendar).fFields[7];
        EVar8 = Calendar::getFirstDayOfWeek(&this->super_Calendar);
        iVar9 = (int)((iVar4 + iVar7) - (iVar9 + EVar8)) % 7;
        if (iVar9 < 0) {
          iVar9 = iVar9 + 7;
        }
        bVar2 = Calendar::getMinimalDaysInFirstWeek(&this->super_Calendar);
        iVar4 = iVar7 + -7;
        if (6U - iVar9 < (uint)bVar2) {
          iVar4 = iVar7;
        }
        iVar3 = Calendar::weekNumber(&this->super_Calendar,iVar4,iVar9 + 1);
        iVar6 = (iVar6 + iVar3 + -1) % iVar3 + 1;
      }
      Calendar::set(&this->super_Calendar,UCAL_WEEK_OF_YEAR,iVar6);
      Calendar::set(&this->super_Calendar,UCAL_YEAR_WOY,uVar5);
      return;
    }
  }
  Calendar::roll(&this->super_Calendar,UStack_60,amount,status);
  return;
}

Assistant:

void
GregorianCalendar::roll(UCalendarDateFields field, int32_t amount, UErrorCode& status)
{
    if((amount == 0) || U_FAILURE(status)) {
        return;
    }

    // J81 processing. (gregorian cutover)
    UBool inCutoverMonth = FALSE;
    int32_t cMonthLen=0; // 'c' for cutover; in days
    int32_t cDayOfMonth=0; // no discontinuity: [0, cMonthLen)
    double cMonthStart=0.0; // in ms

    // Common code - see if we're in the cutover month of the cutover year
    if(get(UCAL_EXTENDED_YEAR, status) == fGregorianCutoverYear) {
        switch (field) {
        case UCAL_DAY_OF_MONTH:
        case UCAL_WEEK_OF_MONTH:
            {
                int32_t max = monthLength(internalGet(UCAL_MONTH));
                UDate t = internalGetTime();
                // We subtract 1 from the DAY_OF_MONTH to make it zero-based, and an
                // additional 10 if we are after the cutover. Thus the monthStart
                // value will be correct iff we actually are in the cutover month.
                cDayOfMonth = internalGet(UCAL_DAY_OF_MONTH) - ((t >= fGregorianCutover) ? 10 : 0);
                cMonthStart = t - ((cDayOfMonth - 1) * kOneDay);
                // A month containing the cutover is 10 days shorter.
                if ((cMonthStart < fGregorianCutover) &&
                    (cMonthStart + (cMonthLen=(max-10))*kOneDay >= fGregorianCutover)) {
                        inCutoverMonth = TRUE;
                    }
            }
            break;
        default:
            ;
        }
    }

    switch (field) {
    case UCAL_WEEK_OF_YEAR: {
        // Unlike WEEK_OF_MONTH, WEEK_OF_YEAR never shifts the day of the
        // week.  Also, rolling the week of the year can have seemingly
        // strange effects simply because the year of the week of year
        // may be different from the calendar year.  For example, the
        // date Dec 28, 1997 is the first day of week 1 of 1998 (if
        // weeks start on Sunday and the minimal days in first week is
        // <= 3).
        int32_t woy = get(UCAL_WEEK_OF_YEAR, status);
        // Get the ISO year, which matches the week of year.  This
        // may be one year before or after the calendar year.
        int32_t isoYear = get(UCAL_YEAR_WOY, status);
        int32_t isoDoy = internalGet(UCAL_DAY_OF_YEAR);
        if (internalGet(UCAL_MONTH) == UCAL_JANUARY) {
            if (woy >= 52) {
                isoDoy += handleGetYearLength(isoYear);
            }
        } else {
            if (woy == 1) {
                isoDoy -= handleGetYearLength(isoYear - 1);
            }
        }
        woy += amount;
        // Do fast checks to avoid unnecessary computation:
        if (woy < 1 || woy > 52) {
            // Determine the last week of the ISO year.
            // We do this using the standard formula we use
            // everywhere in this file.  If we can see that the
            // days at the end of the year are going to fall into
            // week 1 of the next year, we drop the last week by
            // subtracting 7 from the last day of the year.
            int32_t lastDoy = handleGetYearLength(isoYear);
            int32_t lastRelDow = (lastDoy - isoDoy + internalGet(UCAL_DAY_OF_WEEK) -
                getFirstDayOfWeek()) % 7;
            if (lastRelDow < 0) lastRelDow += 7;
            if ((6 - lastRelDow) >= getMinimalDaysInFirstWeek()) lastDoy -= 7;
            int32_t lastWoy = weekNumber(lastDoy, lastRelDow + 1);
            woy = ((woy + lastWoy - 1) % lastWoy) + 1;
        }
        set(UCAL_WEEK_OF_YEAR, woy);
        set(UCAL_YEAR_WOY,isoYear);
        return;
                            }

    case UCAL_DAY_OF_MONTH:
        if( !inCutoverMonth ) { 
            Calendar::roll(field, amount, status);
            return;
        } else {
            // [j81] 1582 special case for DOM
            // The default computation works except when the current month
            // contains the Gregorian cutover.  We handle this special case
            // here.  [j81 - aliu]
            double monthLen = cMonthLen * kOneDay;
            double msIntoMonth = uprv_fmod(internalGetTime() - cMonthStart +
                amount * kOneDay, monthLen);
            if (msIntoMonth < 0) {
                msIntoMonth += monthLen;
            }
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: roll DOM %d  -> %.0lf ms  \n", 
                __FILE__, __LINE__,amount, cMonthLen, cMonthStart+msIntoMonth);
#endif
            setTimeInMillis(cMonthStart + msIntoMonth, status);
            return;
        }

    case UCAL_WEEK_OF_MONTH:
        if( !inCutoverMonth ) { 
            Calendar::roll(field, amount, status);
            return;
        } else {
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: roll WOM %d ??????????????????? \n", 
                __FILE__, __LINE__,amount);
#endif
            // NOTE: following copied from  the old
            //     GregorianCalendar::roll( WEEK_OF_MONTH )  code 

            // This is tricky, because during the roll we may have to shift
            // to a different day of the week.  For example:

            //    s  m  t  w  r  f  s
            //          1  2  3  4  5
            //    6  7  8  9 10 11 12

            // When rolling from the 6th or 7th back one week, we go to the
            // 1st (assuming that the first partial week counts).  The same
            // thing happens at the end of the month.

            // The other tricky thing is that we have to figure out whether
            // the first partial week actually counts or not, based on the
            // minimal first days in the week.  And we have to use the
            // correct first day of the week to delineate the week
            // boundaries.

            // Here's our algorithm.  First, we find the real boundaries of
            // the month.  Then we discard the first partial week if it
            // doesn't count in this locale.  Then we fill in the ends with
            // phantom days, so that the first partial week and the last
            // partial week are full weeks.  We then have a nice square
            // block of weeks.  We do the usual rolling within this block,
            // as is done elsewhere in this method.  If we wind up on one of
            // the phantom days that we added, we recognize this and pin to
            // the first or the last day of the month.  Easy, eh?

            // Another wrinkle: To fix jitterbug 81, we have to make all this
            // work in the oddball month containing the Gregorian cutover.
            // This month is 10 days shorter than usual, and also contains
            // a discontinuity in the days; e.g., the default cutover month
            // is Oct 1582, and goes from day of month 4 to day of month 15.

            // Normalize the DAY_OF_WEEK so that 0 is the first day of the week
            // in this locale.  We have dow in 0..6.
            int32_t dow = internalGet(UCAL_DAY_OF_WEEK) - getFirstDayOfWeek();
            if (dow < 0) 
                dow += 7;

            // Find the day of month, compensating for cutover discontinuity.
            int32_t dom = cDayOfMonth;

            // Find the day of the week (normalized for locale) for the first
            // of the month.
            int32_t fdm = (dow - dom + 1) % 7;
            if (fdm < 0) 
                fdm += 7;

            // Get the first day of the first full week of the month,
            // including phantom days, if any.  Figure out if the first week
            // counts or not; if it counts, then fill in phantom days.  If
            // not, advance to the first real full week (skip the partial week).
            int32_t start;
            if ((7 - fdm) < getMinimalDaysInFirstWeek())
                start = 8 - fdm; // Skip the first partial week
            else
                start = 1 - fdm; // This may be zero or negative

            // Get the day of the week (normalized for locale) for the last
            // day of the month.
            int32_t monthLen = cMonthLen;
            int32_t ldm = (monthLen - dom + dow) % 7;
            // We know monthLen >= DAY_OF_MONTH so we skip the += 7 step here.

            // Get the limit day for the blocked-off rectangular month; that
            // is, the day which is one past the last day of the month,
            // after the month has already been filled in with phantom days
            // to fill out the last week.  This day has a normalized DOW of 0.
            int32_t limit = monthLen + 7 - ldm;

            // Now roll between start and (limit - 1).
            int32_t gap = limit - start;
            int32_t newDom = (dom + amount*7 - start) % gap;
            if (newDom < 0) 
                newDom += gap;
            newDom += start;

            // Finally, pin to the real start and end of the month.
            if (newDom < 1) 
                newDom = 1;
            if (newDom > monthLen) 
                newDom = monthLen;

            // Set the DAY_OF_MONTH.  We rely on the fact that this field
            // takes precedence over everything else (since all other fields
            // are also set at this point).  If this fact changes (if the
            // disambiguation algorithm changes) then we will have to unset
            // the appropriate fields here so that DAY_OF_MONTH is attended
            // to.

            // If we are in the cutover month, manipulate ms directly.  Don't do
            // this in general because it doesn't work across DST boundaries
            // (details, details).  This takes care of the discontinuity.
            setTimeInMillis(cMonthStart + (newDom-1)*kOneDay, status);                
            return;
        }

    default:
        Calendar::roll(field, amount, status);
        return;
    }
}